

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::CompLayer::CompLayer
          (CompLayer *this,Layer *layerModel,VArenaAlloc *allocator)

{
  pointer *pppLVar1;
  unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
  *this_00;
  int iVar2;
  Layer *pLVar3;
  iterator __position;
  pointer ppLVar4;
  pointer ppLVar5;
  VSize VVar6;
  _Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false> __ptr;
  VSize *pVVar7;
  Layer *in_RAX;
  Layer **layer;
  pointer ppOVar8;
  pointer ppLVar9;
  _Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false> _Var10;
  VArenaAlloc *unaff_RBX;
  pointer ppLVar11;
  pointer ppLVar12;
  long lVar13;
  ulong uVar14;
  pointer ppOVar15;
  Layer *item;
  
  Layer::Layer(&this->super_Layer,layerModel);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__CompLayer_001446d8;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mLayers).
  super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mClipper)._M_t.
  super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
  ._M_t.
  super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
  .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl =
       (Clipper *)0x0;
  pLVar3 = (this->super_Layer).mLayerData;
  ppOVar8 = (pLVar3->super_Group).mChildren.
            super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar15 = (pLVar3->super_Group).mChildren.
             super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar8 != ppOVar15) {
    std::
    vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
    ::reserve(&this->mLayers,(long)ppOVar15 - (long)ppOVar8 >> 3);
    pLVar3 = (this->super_Layer).mLayerData;
    ppOVar8 = (pLVar3->super_Group).mChildren.
              super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppOVar15 = (pLVar3->super_Group).mChildren.
               super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppOVar15 != ppOVar8) {
    do {
      in_RAX = (Layer *)createLayerItem(in_RAX,unaff_RBX);
      if (in_RAX != (Layer *)0x0) {
        __position._M_current =
             (this->mLayers).
             super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<rlottie::internal::renderer::Layer*,std::allocator<rlottie::internal::renderer::Layer*>>
          ::_M_realloc_insert<rlottie::internal::renderer::Layer*const&>
                    ((vector<rlottie::internal::renderer::Layer*,std::allocator<rlottie::internal::renderer::Layer*>>
                      *)&this->mLayers,__position,(Layer **)&stack0xffffffffffffffc8);
        }
        else {
          *__position._M_current = (Layer *)in_RAX;
          pppLVar1 = &(this->mLayers).
                      super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
      }
      ppOVar15 = ppOVar15 + -1;
    } while (ppOVar15 !=
             (((this->super_Layer).mLayerData)->super_Group).mChildren.
             super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  ppLVar9 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar4 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppLVar9 == ppLVar4) {
      VVar6 = layerModel->mLayerSize;
      if (0 < VVar6.mh && 0 < VVar6.mw) {
        this_00 = &this->mClipper;
        _Var10._M_head_impl = (Clipper *)operator_new(0x30);
        (_Var10._M_head_impl)->mSize = VVar6;
        vcow_ptr<VPath::VPathData>::vcow_ptr
                  ((vcow_ptr<VPath::VPathData> *)&(_Var10._M_head_impl)->mPath);
        vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)&(_Var10._M_head_impl)->mMaskedRle);
        *(int *)&((_Var10._M_head_impl)->mRasterizer).d.
                 super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = 0;
        *(int *)((long)&((_Var10._M_head_impl)->mRasterizer).d.
                        super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 4) = 0;
        pVVar7 = (VSize *)((long)&(_Var10._M_head_impl)->mRasterizer + 8);
        pVVar7->mw = 0;
        pVVar7->mh = 0;
        *(undefined1 *)&((VSize *)&(_Var10._M_head_impl)->mRasterRequest)->mw = 0;
        __ptr._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
             ._M_t.
             super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
             .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl;
        (this_00->_M_t).
        super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
        ._M_t.
        super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
        .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl =
             _Var10._M_head_impl;
        if (__ptr._M_head_impl != (Clipper *)0x0) {
          std::default_delete<rlottie::internal::renderer::Clipper>::operator()
                    ((default_delete<rlottie::internal::renderer::Clipper> *)this_00,
                     __ptr._M_head_impl);
        }
      }
      if (8 < (ulong)((long)(this->mLayers).
                            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mLayers).
                           super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        (this->super_Layer).mComplexContent = true;
      }
      return;
    }
    iVar2 = (*ppLVar9)->mLayerData->mParentId;
    if (-1 < iVar2) {
      ppLVar12 = (this->mLayers).
                 super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar5 = (this->mLayers).
                super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar14 = (long)ppLVar5 - (long)ppLVar12;
      if (0 < (long)uVar14 >> 5) {
        ppLVar11 = (pointer)((uVar14 & 0xffffffffffffffe0) + (long)ppLVar12);
        lVar13 = ((long)uVar14 >> 5) + 1;
        ppLVar12 = ppLVar12 + 2;
        do {
          if (ppLVar12[-2]->mLayerData->mId == iVar2) {
            ppLVar12 = ppLVar12 + -2;
            goto LAB_001289be;
          }
          if (ppLVar12[-1]->mLayerData->mId == iVar2) {
            ppLVar12 = ppLVar12 + -1;
            goto LAB_001289be;
          }
          if ((*ppLVar12)->mLayerData->mId == iVar2) goto LAB_001289be;
          if (ppLVar12[1]->mLayerData->mId == iVar2) {
            ppLVar12 = ppLVar12 + 1;
            goto LAB_001289be;
          }
          lVar13 = lVar13 + -1;
          ppLVar12 = ppLVar12 + 4;
        } while (1 < lVar13);
        uVar14 = (long)ppLVar5 - (long)ppLVar11;
        ppLVar12 = ppLVar11;
      }
      lVar13 = (long)uVar14 >> 3;
      if (lVar13 == 1) {
LAB_0012899a:
        if ((*ppLVar12)->mLayerData->mId != iVar2) {
          ppLVar12 = ppLVar5;
        }
      }
      else if (lVar13 == 2) {
LAB_00128989:
        if ((*ppLVar12)->mLayerData->mId != iVar2) {
          ppLVar12 = ppLVar12 + 1;
          goto LAB_0012899a;
        }
      }
      else {
        if (lVar13 != 3) goto LAB_001289ca;
        if ((*ppLVar12)->mLayerData->mId != iVar2) {
          ppLVar12 = ppLVar12 + 1;
          goto LAB_00128989;
        }
      }
LAB_001289be:
      if (ppLVar12 != ppLVar5) {
        (*ppLVar9)->mParentLayer = *ppLVar12;
      }
    }
LAB_001289ca:
    ppLVar9 = ppLVar9 + 1;
  } while( true );
}

Assistant:

renderer::CompLayer::CompLayer(model::Layer *layerModel, VArenaAlloc *allocator)
    : renderer::Layer(layerModel)
{
    if (!mLayerData->mChildren.empty())
        mLayers.reserve(mLayerData->mChildren.size());

    // 1. keep the layer in back-to-front order.
    // as lottie model keeps the data in front-toback-order.
    for (auto it = mLayerData->mChildren.crbegin();
         it != mLayerData->mChildren.rend(); ++it) {
        auto model = static_cast<model::Layer *>(*it);
        auto item = createLayerItem(model, allocator);
        if (item) mLayers.push_back(item);
    }

    // 2. update parent layer
    for (const auto &layer : mLayers) {
        int id = layer->parentId();
        if (id >= 0) {
            auto search =
                std::find_if(mLayers.begin(), mLayers.end(),
                             [id](const auto &val) { return val->id() == id; });
            if (search != mLayers.end()) layer->setParentLayer(*search);
        }
    }

    // 4. check if its a nested composition
    if (!layerModel->layerSize().empty()) {
        mClipper = std::make_unique<renderer::Clipper>(layerModel->layerSize());
    }

    if (mLayers.size() > 1) setComplexContent(true);
}